

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateDataTest::CheckErrorAndLog
          (InvalidateDataTest *this,GLenum attachment)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1b8;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"InvalidateDataTest unexpectedly generated ");
    local_1a8.m_getName = glu::getErrorName;
    local_1a8.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," error for attachment ");
    local_1b8.m_getName = glu::getFramebufferAttachmentName;
    local_1b8.m_value = attachment;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Test fails.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == 0;
}

Assistant:

bool InvalidateDataTest::CheckErrorAndLog(const glw::GLenum attachment)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check error. */
	if (glw::GLenum error = gl.getError())
	{
		/* There is an error. Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "InvalidateDataTest unexpectedly generated "
											<< glu::getErrorStr(error) << " error for attachment "
											<< glu::getFramebufferAttachmentStr(attachment) << ". Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}